

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

ssize_t __thiscall Packet::read(Packet *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_type sVar6;
  undefined4 in_register_00000034;
  uint32_t val_len;
  char flags_buf [4];
  vector<char,_std::allocator<char>_> extras;
  uint32_t bytes_read;
  char *in_stack_ffffffffffffff28;
  Packet *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  Packet *in_stack_ffffffffffffff50;
  allocator<char> local_31;
  vector<char,_std::allocator<char>_> local_30;
  uint local_14;
  Packet *local_10;
  Packet *local_8;
  
  local_10 = (Packet *)CONCAT44(in_register_00000034,__fd);
  local_14 = 0;
  local_8 = this;
  if (0 < this->ext_len) {
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (&in_stack_ffffffffffffff50->key,
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
    std::allocator<char>::~allocator(&local_31);
    for (; local_14 < (uint)this->ext_len; local_14 = local_14 + (int)sVar5) {
      in_stack_ffffffffffffff50 = local_10;
      boost::asio::buffer<char,std::allocator<char>>(&in_stack_ffffffffffffff30->key);
      sVar5 = boost::asio::
              basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ::receive<boost::asio::mutable_buffers_1>
                        ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                          *)in_stack_ffffffffffffff50,
                         (mutable_buffers_1 *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    local_14 = 0;
    sVar6 = std::vector<char,_std::allocator<char>_>::size(&local_30);
    if (4 < sVar6) {
      in_stack_ffffffffffffff40 = (allocator_type *)0x0;
      std::vector<char,_std::allocator<char>_>::operator[](&local_30,0);
      std::vector<char,_std::allocator<char>_>::operator[](&local_30,1);
      std::vector<char,_std::allocator<char>_>::operator[](&local_30,2);
      std::vector<char,_std::allocator<char>_>::operator[](&local_30,3);
      in_stack_ffffffffffffff4c =
           readUInt32LE(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0x15c991);
      this->flags = in_stack_ffffffffffffff4c;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff40);
  }
  if (this->key_len != 0) {
    std::vector<char,_std::allocator<char>_>::resize
              (&in_stack_ffffffffffffff50->key,
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    for (; local_14 < this->key_len; local_14 = local_14 + (int)sVar5) {
      in_stack_ffffffffffffff30 = local_10;
      boost::asio::buffer<char,std::allocator<char>>(&local_10->key);
      sVar5 = boost::asio::
              basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ::receive<boost::asio::mutable_buffers_1>
                        ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                          *)in_stack_ffffffffffffff50,
                         (mutable_buffers_1 *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    local_14 = 0;
  }
  uVar4 = this->bod_len;
  if ((uint)this->key_len < this->bod_len) {
    uVar2 = this->bod_len;
    uVar1 = this->key_len;
    iVar3 = this->ext_len;
    std::vector<char,_std::allocator<char>_>::resize
              (&in_stack_ffffffffffffff50->key,
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    for (; uVar4 = local_14, local_14 < (uVar2 - uVar1) - iVar3; local_14 = local_14 + (int)sVar5) {
      boost::asio::buffer<char,std::allocator<char>>(&in_stack_ffffffffffffff30->key);
      sVar5 = boost::asio::
              basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ::receive<boost::asio::mutable_buffers_1>
                        ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                          *)in_stack_ffffffffffffff50,
                         (mutable_buffers_1 *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
  }
  return (ulong)uVar4;
}

Assistant:

void Packet::read(socket& socket) {
  std::uint32_t bytes_read = 0;

  if (ext_len > 0) {
    std::vector<char> extras(ext_len);
    while (bytes_read < static_cast<std::uint32_t>(ext_len)) {
      bytes_read += socket.receive(boost::asio::buffer(extras));
    }
    bytes_read = 0;

    if (extras.size() > 4) {
      char flags_buf[4] = { extras[0], extras[1], extras[2], extras[3] };
      flags = readUInt32LE(flags_buf, 0);
    }
  }

  if (key_len > 0) {
    key.resize(key_len);
    while (bytes_read < key_len) {
      bytes_read += socket.receive(boost::asio::buffer(key));
    }
    bytes_read = 0;
  }

  if (bod_len > key_len) {
    std::uint32_t val_len = bod_len - key_len - ext_len;
    val.resize(val_len);
    while (bytes_read < val_len) {
      bytes_read += socket.receive(boost::asio::buffer(val));
    }
  }
}